

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::StartsWith::~StartsWith(StartsWith *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__StartsWith_001f13c0;
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  MatcherImpl<Catch::Matchers::Impl::StdString::StartsWith,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~MatcherImpl((MatcherImpl<Catch::Matchers::Impl::StdString::StartsWith,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x17ea24);
  return;
}

Assistant:

Matchers::Impl::StdString::StartsWith::~StartsWith() {}